

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_createfile(HSQUIRRELVM v,SQFILE file,SQBool own)

{
  undefined8 uVar1;
  long lVar2;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  SQInteger top;
  
  uVar1 = sq_gettop(in_RDI);
  sq_pushregistrytable(in_RDI);
  sq_pushstring(in_RDI,"std_file",0xffffffffffffffff);
  lVar2 = sq_get(in_RDI,0xfffffffffffffffe);
  if (-1 < lVar2) {
    sq_remove(in_RDI,0xfffffffffffffffe);
    sq_pushroottable(in_RDI);
    sq_pushuserpointer(in_RDI,in_RSI);
    if (in_RDX == 0) {
      sq_pushnull(in_RDI);
    }
    else {
      sq_pushinteger(in_RDI,1);
    }
    lVar2 = sq_call(in_RDI,3,1,0);
    if (-1 < lVar2) {
      sq_remove(in_RDI,0xfffffffffffffffe);
      return 0;
    }
  }
  sq_settop(in_RDI,uVar1);
  return -1;
}

Assistant:

SQRESULT sqstd_createfile(HSQUIRRELVM v, SQFILE file,SQBool own)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_file"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_pushroottable(v); // push the this
        sq_pushuserpointer(v,file); //file
        if(own){
            sq_pushinteger(v,1); //true
        }
        else{
            sq_pushnull(v); //false
        }
        if(SQ_SUCCEEDED( sq_call(v,3,SQTrue,SQFalse) )) {
            sq_remove(v,-2);
            return SQ_OK;
        }
    }
    sq_settop(v,top);
    return SQ_ERROR;
}